

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_struct
          (ProtocolReader *this,FieldType *value,EventKlassField *field,Event *event,
          Event *base_event)

{
  KlassRegister *this_00;
  bool bVar1;
  Event *pEVar2;
  bool local_179;
  Event local_160;
  undefined1 local_110 [32];
  undefined1 local_f0 [24];
  Event sub_event;
  undefined1 local_88 [6];
  bool is_error;
  string local_58 [32];
  Event *local_38;
  Event *base_event_local;
  Event *event_local;
  EventKlassField *field_local;
  FieldType *value_local;
  ProtocolReader *this_local;
  
  local_38 = base_event;
  base_event_local = event;
  event_local = (Event *)field;
  field_local = (EventKlassField *)value;
  value_local = (FieldType *)this;
  EventKlassField::get_type_name_abi_cxx11_((EventKlassField *)local_58);
  sub_event._timestamp._7_1_ = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"HT_Event");
  local_179 = false;
  if (bVar1) {
    EventKlassField::get_name_abi_cxx11_((EventKlassField *)local_88);
    sub_event._timestamp._7_1_ = 1;
    local_179 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"base");
  }
  if ((sub_event._timestamp._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::~string(local_58);
  if (local_179 == false) {
    this_00 = this->_klass_register;
    EventKlassField::get_type_name_abi_cxx11_((EventKlassField *)local_110);
    KlassRegister::get_klass_id(this_00,(string *)local_110);
    KlassRegister::get_klass((KlassRegister *)local_f0,(HT_EventKlassId)this_00);
    Event::Event((Event *)(local_f0 + 0x10),
                 (shared_ptr<const_HawkTracer::parser::EventKlass> *)local_f0);
    std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr
              ((shared_ptr<const_HawkTracer::parser::EventKlass> *)local_f0);
    std::__cxx11::string::~string((string *)local_110);
    _read_event(this,(bool *)((long)&sub_event._timestamp + 6),(Event *)(local_f0 + 0x10),local_38);
    pEVar2 = base_event_local;
    if ((this->_flat_events & 1U) == 0) {
      pEVar2 = (Event *)operator_new(0x50);
      Event::Event(pEVar2,(Event *)(local_f0 + 0x10));
      *(Event **)field_local = pEVar2;
    }
    else {
      Event::Event(&local_160,(Event *)(local_f0 + 0x10));
      Event::merge(pEVar2,&local_160);
      Event::~Event(&local_160);
    }
    this_local._7_1_ = (sub_event._timestamp._6_1_ ^ 0xff) & 1;
    Event::~Event((Event *)(local_f0 + 0x10));
  }
  else {
    if ((this->_flat_events & 1U) == 0) {
      if (local_38 == (Event *)0x0) {
        __assert_fail("base_event != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                      ,0xdc,
                      "bool HawkTracer::parser::ProtocolReader::_read_struct(FieldType &, const EventKlassField &, Event *, Event *)"
                     );
      }
      pEVar2 = (Event *)operator_new(0x50);
      Event::Event(pEVar2,local_38);
      *(Event **)field_local = pEVar2;
    }
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ProtocolReader::_read_struct(FieldType& value, const EventKlassField& field, Event* event, Event* base_event)
{
    if (field.get_type_name() == "HT_Event" && field.get_name() == "base")
    {
        if (!_flat_events)
        {
            assert(base_event != nullptr);
            value.f_EVENT = new Event(std::move(*base_event));
        }
        return true;
    }
    else
    {
        bool is_error;
        Event sub_event(_klass_register->get_klass(_klass_register->get_klass_id(field.get_type_name())));
        _read_event(is_error, sub_event, base_event);
        if (_flat_events)
        {
            event->merge(std::move(sub_event));
        }
        else
        {
            value.f_EVENT = new Event(std::move(sub_event));
        }
        return !is_error;
    }
}